

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O1

string * to_hex<int>(string *__return_storage_ptr__,int t)

{
  long lVar1;
  char cVar2;
  ostringstream ostm;
  undefined1 auStack_198 [8];
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"0x",2);
  lVar1 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)auStack_198 + (char)lVar1 + '\b');
    acStack_b0[lVar1] = cVar2;
    acStack_b0[lVar1 + 1] = '\x01';
  }
  acStack_b0[lVar1] = '0';
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 8;
  std::ostream::operator<<((ostream *)local_190,t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_hex(T t)
{
	std::ostringstream ostm;
	ostm << "0x" << std::setfill('0') << std::hex << std::setw(sizeof(t) <= 4 ? 8 : 16) << t;
	return ostm.str();
}